

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O3

void flatbuffers::GenStruct
               (StructDef *struct_def,Table *table,int indent,int indent_step,string *_text)

{
  Value *pVVar1;
  BaseType BVar2;
  FieldDef *fd;
  Table val;
  ushort uVar3;
  short val_00;
  unsigned_short val_01;
  int indent_00;
  ulong uVar4;
  pointer ppFVar5;
  uint enum_idx;
  int val_02;
  uint uVar6;
  Table *val_03;
  long val_04;
  unsigned_long val_05;
  int iVar7;
  float val_06;
  undefined4 uVar8;
  undefined4 uVar9;
  StructDef *local_50;
  
  std::__cxx11::string::append((char *)_text);
  std::__cxx11::string::append((char *)_text);
  ppFVar5 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar5 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    indent_00 = indent + indent_step;
    iVar7 = 0;
    local_50 = (StructDef *)0x0;
    do {
      fd = *ppFVar5;
      if (struct_def->fixed == false) {
        uVar6 = (fd->value).offset;
        if (((ushort)uVar6 < *(ushort *)(table + -(long)*(int *)table)) &&
           (*(short *)(table + ((ulong)(uVar6 & 0xffff) - (long)*(int *)table)) != 0))
        goto LAB_00113184;
      }
      else {
LAB_00113184:
        if (iVar7 != 0) {
          std::__cxx11::string::append((char *)_text);
          std::__cxx11::string::append((char *)_text);
        }
        iVar7 = iVar7 + 1;
        std::__cxx11::string::_M_replace_aux((ulong)_text,_text->_M_string_length,0,(char)indent_00)
        ;
        std::__cxx11::string::_M_append
                  ((char *)_text,(ulong)(fd->super_Definition).name._M_dataplus._M_p);
        std::__cxx11::string::append((char *)_text);
        BVar2 = (fd->value).type.base_type;
        if (BVar2 < (BASE_TYPE_UNION|BASE_TYPE_UTYPE)) {
          pVVar1 = &fd->value;
          switch(BVar2) {
          default:
            GenField<unsigned_char>(fd,table,struct_def->fixed,indent_00,indent_step,_text);
            break;
          case BASE_TYPE_CHAR:
            uVar6 = (fd->value).offset;
            uVar4 = (ulong)uVar6;
            if (struct_def->fixed == true) {
LAB_001133ae:
              val = table[uVar4];
            }
            else {
              uVar3 = (ushort)uVar6;
              if ((uVar3 < *(ushort *)(table + -(long)*(int *)table)) &&
                 (uVar4 = (ulong)*(ushort *)(table + ((ulong)uVar3 - (long)*(int *)table)),
                 uVar4 != 0)) goto LAB_001133ae;
              val = (Table)0x0;
            }
            Print<signed_char>((char)val,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
            break;
          case BASE_TYPE_SHORT:
            uVar6 = (fd->value).offset;
            uVar4 = (ulong)uVar6;
            if (struct_def->fixed == true) {
LAB_00113501:
              val_00 = *(short *)(table + uVar4);
            }
            else {
              uVar3 = (ushort)uVar6;
              if ((uVar3 < *(ushort *)(table + -(long)*(int *)table)) &&
                 (uVar4 = (ulong)*(ushort *)(table + ((ulong)uVar3 - (long)*(int *)table)),
                 uVar4 != 0)) goto LAB_00113501;
              val_00 = 0;
            }
            Print<short>(val_00,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
            break;
          case BASE_TYPE_USHORT:
            uVar6 = (fd->value).offset;
            uVar4 = (ulong)uVar6;
            if (struct_def->fixed == true) {
LAB_00113547:
              val_01 = *(unsigned_short *)(table + uVar4);
            }
            else {
              uVar3 = (ushort)uVar6;
              if ((uVar3 < *(ushort *)(table + -(long)*(int *)table)) &&
                 (uVar4 = (ulong)*(ushort *)(table + ((ulong)uVar3 - (long)*(int *)table)),
                 uVar4 != 0)) goto LAB_00113547;
              val_01 = 0;
            }
            Print<unsigned_short>(val_01,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
            break;
          case BASE_TYPE_INT:
            uVar6 = (fd->value).offset;
            uVar4 = (ulong)uVar6;
            if (struct_def->fixed == true) {
LAB_00113498:
              val_02 = *(int *)(table + uVar4);
            }
            else {
              uVar3 = (ushort)uVar6;
              val_02 = 0;
              if ((uVar3 < *(ushort *)(table + -(long)*(int *)table)) &&
                 (uVar4 = (ulong)*(ushort *)(table + ((ulong)uVar3 - (long)*(int *)table)),
                 val_02 = 0, uVar4 != 0)) goto LAB_00113498;
            }
            Print<int>(val_02,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
            break;
          case BASE_TYPE_UINT:
            uVar6 = (fd->value).offset;
            uVar4 = (ulong)uVar6;
            if (struct_def->fixed == true) {
LAB_001135cc:
              uVar6 = *(uint *)(table + uVar4);
            }
            else {
              uVar3 = (ushort)uVar6;
              uVar6 = 0;
              if ((uVar3 < *(ushort *)(table + -(long)*(int *)table)) &&
                 (uVar4 = (ulong)*(ushort *)(table + ((ulong)uVar3 - (long)*(int *)table)),
                 uVar6 = 0, uVar4 != 0)) goto LAB_001135cc;
            }
            Print<unsigned_int>(uVar6,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
            break;
          case BASE_TYPE_LONG:
            uVar6 = (fd->value).offset;
            uVar4 = (ulong)uVar6;
            if (struct_def->fixed == true) {
LAB_00113459:
              val_04 = *(long *)(table + uVar4);
            }
            else {
              uVar3 = (ushort)uVar6;
              if ((uVar3 < *(ushort *)(table + -(long)*(int *)table)) &&
                 (uVar4 = (ulong)*(ushort *)(table + ((ulong)uVar3 - (long)*(int *)table)),
                 uVar4 != 0)) goto LAB_00113459;
              val_04 = 0;
            }
            Print<long>(val_04,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
            break;
          case BASE_TYPE_ULONG:
            uVar6 = (fd->value).offset;
            uVar4 = (ulong)uVar6;
            if (struct_def->fixed == true) {
LAB_0011358d:
              val_05 = *(unsigned_long *)(table + uVar4);
            }
            else {
              uVar3 = (ushort)uVar6;
              if ((uVar3 < *(ushort *)(table + -(long)*(int *)table)) &&
                 (uVar4 = (ulong)*(ushort *)(table + ((ulong)uVar3 - (long)*(int *)table)),
                 uVar4 != 0)) goto LAB_0011358d;
              val_05 = 0;
            }
            Print<unsigned_long>(val_05,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
            break;
          case BASE_TYPE_FLOAT:
            uVar6 = (fd->value).offset;
            uVar4 = (ulong)uVar6;
            if (struct_def->fixed == true) {
LAB_00113343:
              val_06 = *(float *)(table + uVar4);
            }
            else {
              val_06 = 0.0;
              uVar3 = (ushort)uVar6;
              if ((uVar3 < *(ushort *)(table + -(long)*(int *)table)) &&
                 (uVar4 = (ulong)*(ushort *)(table + ((ulong)uVar3 - (long)*(int *)table)),
                 uVar4 != 0)) goto LAB_00113343;
            }
            Print<float>(val_06,pVVar1->type,indent_step,indent_00,(StructDef *)0x0,_text);
            break;
          case BASE_TYPE_DOUBLE:
            uVar6 = (fd->value).offset;
            uVar4 = (ulong)uVar6;
            if (struct_def->fixed == true) {
LAB_001133ee:
              uVar8 = (undefined4)*(undefined8 *)(table + uVar4);
              uVar9 = (undefined4)((ulong)*(undefined8 *)(table + uVar4) >> 0x20);
            }
            else {
              uVar8 = 0;
              uVar9 = 0;
              uVar3 = (ushort)uVar6;
              if ((uVar3 < *(ushort *)(table + -(long)*(int *)table)) &&
                 (uVar4 = (ulong)*(ushort *)(table + ((ulong)uVar3 - (long)*(int *)table)),
                 uVar4 != 0)) goto LAB_001133ee;
            }
            Print<double>((double)CONCAT44(uVar9,uVar8),pVVar1->type,indent_step,indent_00,
                          (StructDef *)0x0,_text);
            break;
          case BASE_TYPE_STRING:
          case BASE_TYPE_VECTOR:
          case BASE_TYPE_STRUCT:
          case BASE_TYPE_UNION:
            if (struct_def->fixed == true) {
              if ((BVar2 != BASE_TYPE_STRUCT) || (((fd->value).type.struct_def)->fixed == false)) {
                __assert_fail("IsStruct(fd.value.type)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/src/idl_gen_text.cpp"
                              ,0x98,
                              "void flatbuffers::GenFieldOffset(const FieldDef &, const Table *, bool, int, int, StructDef *, std::string *)"
                             );
              }
              uVar4 = (ulong)(uint)(fd->value).offset;
LAB_0011325e:
              val_03 = table + uVar4;
            }
            else if ((BVar2 == BASE_TYPE_STRUCT) && (((fd->value).type.struct_def)->fixed == true))
            {
              uVar6 = (fd->value).offset;
              if (((ushort)uVar6 < *(ushort *)(table + -(long)*(int *)table)) &&
                 (*(ushort *)(table + ((ulong)(uVar6 & 0xffff) - (long)*(int *)table)) != 0)) {
                uVar4 = (ulong)*(ushort *)(table + ((ulong)(uVar6 & 0xffff) - (long)*(int *)table));
                goto LAB_0011325e;
              }
LAB_001132de:
              val_03 = (Table *)0x0;
            }
            else {
              uVar6 = (fd->value).offset;
              if ((*(ushort *)(table + -(long)*(int *)table) <= (ushort)uVar6) ||
                 (uVar4 = (ulong)*(ushort *)
                                  (table + ((ulong)(uVar6 & 0xffff) - (long)*(int *)table)),
                 uVar4 == 0)) goto LAB_001132de;
              val_03 = table + *(uint *)(table + uVar4) + uVar4;
            }
            Print<void_const*>(val_03,pVVar1->type,indent_00,indent_step,local_50,_text);
          }
          if ((pVVar1->type).base_type == BASE_TYPE_UTYPE) {
            uVar6 = (fd->value).offset;
            enum_idx = 0;
            if (((ushort)uVar6 < *(ushort *)(table + -(long)*(int *)table)) &&
               (enum_idx = 0,
               (ulong)*(ushort *)(table + ((ulong)(uVar6 & 0xffff) - (long)*(int *)table)) != 0)) {
              enum_idx = (uint)(byte)table[*(ushort *)
                                            (table + ((ulong)(uVar6 & 0xffff) - (long)*(int *)table)
                                            )];
            }
            local_50 = EnumDef::ReverseLookup((fd->value).type.enum_def,enum_idx);
          }
        }
      }
      ppFVar5 = ppFVar5 + 1;
    } while (ppFVar5 !=
             (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::string::append((char *)_text);
  std::__cxx11::string::_M_replace_aux((ulong)_text,_text->_M_string_length,0,(char)indent);
  std::__cxx11::string::append((char *)_text);
  return;
}

Assistant:

static void GenStruct(const StructDef &struct_def, const Table *table,
                      int indent, int indent_step, std::string *_text) {
  std::string &text = *_text;
  text += "{";
  text += NewLine(indent_step);
  int fieldout = 0;
  StructDef *union_sd = nullptr;
  for (auto it = struct_def.fields.vec.begin();
       it != struct_def.fields.vec.end();
       ++it) {
    FieldDef &fd = **it;
    if (struct_def.fixed || table->CheckField(fd.value.offset)) {
      // The field is present.
      if (fieldout++) {
        text += ",";
        text += NewLine(indent_step);
      }
      text.append(indent + indent_step, ' ');
      text += fd.name;
      text += ": ";
      switch (fd.value.type.base_type) {
         #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE) \
           case BASE_TYPE_ ## ENUM: \
              GenField<CTYPE>(fd, table, struct_def.fixed, \
                              indent + indent_step, indent_step, _text); \
              break;
          FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
        // Generate drop-thru case statements for all pointer types:
        #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE) \
          case BASE_TYPE_ ## ENUM:
          FLATBUFFERS_GEN_TYPES_POINTER(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
            GenFieldOffset(fd, table, struct_def.fixed, indent + indent_step,
                           indent_step, union_sd, _text);
            break;
      }
      if (fd.value.type.base_type == BASE_TYPE_UTYPE) {
        union_sd = fd.value.type.enum_def->ReverseLookup(
                                 table->GetField<uint8_t>(fd.value.offset, 0));
      }
    }
  }
  text += NewLine(indent_step);
  text.append(indent, ' ');
  text += "}";
}